

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::is_stage_output_block_member_masked
          (CompilerGLSL *this,SPIRVariable *var,uint32_t index,bool strip_array)

{
  bool bVar1;
  uint32_t uVar2;
  TypedID<(spirv_cross::Types)1> id;
  uint32_t component_00;
  uint32_t component;
  uint32_t location;
  BuiltIn builtin;
  SPIRType *pSStack_30;
  bool is_block;
  SPIRType *type;
  bool strip_array_local;
  SPIRVariable *pSStack_20;
  uint32_t index_local;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  type._3_1_ = strip_array;
  type._4_4_ = index;
  pSStack_20 = var;
  var_local = (SPIRVariable *)this;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  pSStack_30 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
  location = (pSStack_30->super_IVariant).self.id;
  builtin._3_1_ = Compiler::has_decoration(&this->super_Compiler,(ID)location,DecorationBlock);
  if ((bool)builtin._3_1_) {
    component = 0x7fffffff;
    bVar1 = Compiler::is_member_builtin(&this->super_Compiler,pSStack_30,type._4_4_,&component);
    if (bVar1) {
      this_local._7_1_ = is_stage_output_builtin_masked(this,component);
    }
    else {
      uVar2 = get_declared_member_location(this,pSStack_20,type._4_4_,(bool)(type._3_1_ & 1));
      id = TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_30->super_IVariant).self);
      component_00 = Compiler::get_member_decoration
                               (&this->super_Compiler,id.id,type._4_4_,DecorationComponent);
      this_local._7_1_ = is_stage_output_location_masked(this,uVar2,component_00);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::is_stage_output_block_member_masked(const SPIRVariable &var, uint32_t index, bool strip_array) const
{
	auto &type = get<SPIRType>(var.basetype);
	bool is_block = has_decoration(type.self, DecorationBlock);
	if (!is_block)
		return false;

	BuiltIn builtin = BuiltInMax;
	if (is_member_builtin(type, index, &builtin))
	{
		return is_stage_output_builtin_masked(builtin);
	}
	else
	{
		uint32_t location = get_declared_member_location(var, index, strip_array);
		uint32_t component = get_member_decoration(type.self, index, DecorationComponent);
		return is_stage_output_location_masked(location, component);
	}
}